

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lz4.c
# Opt level: O0

int LZ4_decompress_fast_extDict
              (char *source,char *dest,int originalSize,void *dictStart,size_t dictSize)

{
  byte bVar1;
  U16 UVar2;
  BYTE *pBVar3;
  size_t sVar4;
  ulong __n;
  ulong __n_00;
  BYTE *pBVar5;
  size_t dictSize_local;
  void *dictStart_local;
  int originalSize_local;
  char *dest_local;
  char *source_local;
  size_t u;
  size_t extml;
  BYTE *extMatch;
  BYTE *dictEnd;
  BYTE *match;
  size_t offset;
  size_t ml;
  size_t ll;
  uint token;
  BYTE *prefixStart;
  BYTE *oend;
  BYTE *op;
  BYTE *ip;
  void *local_38;
  undefined8 local_30;
  int local_24;
  char *local_20;
  char *local_18;
  
  local_30 = 0;
  pBVar3 = (BYTE *)(dest + originalSize);
  oend = (BYTE *)dest;
  op = (BYTE *)source;
  ip = (BYTE *)dictSize;
  local_38 = dictStart;
  local_24 = originalSize;
  local_20 = dest;
  local_18 = source;
  while( true ) {
    pBVar5 = op + 1;
    bVar1 = *op;
    ml = (size_t)(bVar1 >> 4);
    op = pBVar5;
    if (ml == 0xf) {
      sVar4 = read_long_length_no_check(&op);
      ml = sVar4 + 0xf;
    }
    if ((ulong)((long)pBVar3 - (long)oend) < ml) {
      return -1;
    }
    memmove(oend,op,ml);
    oend = oend + ml;
    op = op + ml;
    if ((ulong)((long)pBVar3 - (long)oend) < 0xc) {
      if (oend == pBVar3) {
        return (int)op - (int)local_18;
      }
      return -1;
    }
    offset = (size_t)(bVar1 & 0xf);
    UVar2 = LZ4_readLE16(op);
    pBVar5 = (BYTE *)(ulong)UVar2;
    op = op + 2;
    if (offset == 0xf) {
      sVar4 = read_long_length_no_check(&op);
      offset = sVar4 + 0xf;
    }
    __n = offset + 4;
    if ((ulong)((long)pBVar3 - (long)oend) < __n) break;
    dictEnd = oend + -(long)pBVar5;
    if (ip + ((long)oend - (long)dest) < pBVar5) {
      return -1;
    }
    offset = __n;
    if (oend + -(long)dest < pBVar5) {
      pBVar5 = (BYTE *)((long)local_38 + (long)ip) + -((long)pBVar5 - ((long)oend - (long)dest));
      __n_00 = ((long)local_38 + (long)ip) - (long)pBVar5;
      if (__n < __n_00) {
        memmove(oend,pBVar5,__n);
        offset = 0;
        __n_00 = __n;
      }
      else {
        memmove(oend,pBVar5,__n_00);
        offset = __n - __n_00;
      }
      oend = oend + __n_00;
      dictEnd = (BYTE *)dest;
    }
    for (source_local = (char *)0x0; source_local < offset; source_local = source_local + 1) {
      oend[(long)source_local] = dictEnd[(long)source_local];
    }
    oend = oend + offset;
    if ((ulong)((long)pBVar3 - (long)oend) < 5) {
      return -1;
    }
  }
  return -1;
}

Assistant:

LZ4_FORCE_O2
static int LZ4_decompress_fast_extDict(const char* source, char* dest, int originalSize,
                                       const void* dictStart, size_t dictSize)
{
    return LZ4_decompress_unsafe_generic(
                (const BYTE*)source, (BYTE*)dest, originalSize,
                0, (const BYTE*)dictStart, dictSize);
}